

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void assembler::anon_unknown_0::execute_operation<assembler::(anonymous_namespace)::ShlOper>
               (operand operand1,operand operand2,uint64_t operand1_mem,uint64_t operand2_mem,
               registers *regs)

{
  uint8_t uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  byte bVar6;
  
  puVar2 = get_address_64bit(operand1,operand1_mem,regs);
  bVar6 = (byte)operand2_mem;
  if (puVar2 == (uint64_t *)0x0) {
    puVar4 = get_address_8bit(operand1,operand1_mem,regs);
    if (puVar4 == (uint8_t *)0x0) {
      return;
    }
    pbVar5 = get_address_8bit(operand2,operand2_mem,regs);
    if (pbVar5 == (byte *)0x0) {
      if (operand2 != NUMBER) {
        return;
      }
      uVar1 = *puVar4;
    }
    else {
      bVar6 = *pbVar5;
      uVar1 = *puVar4;
    }
    *puVar4 = uVar1 << (bVar6 & 0x1f);
    return;
  }
  puVar3 = get_address_64bit(operand2,operand2_mem,regs);
  if (puVar3 == (uint64_t *)0x0) {
    if ((operand2 == LABELADDRESS) || (operand2 == NUMBER)) goto LAB_00120849;
    puVar3 = (uint64_t *)get_address_8bit(operand2,operand2_mem,regs);
    if (puVar3 == (uint64_t *)0x0) {
      return;
    }
  }
  bVar6 = (byte)*puVar3;
LAB_00120849:
  *puVar2 = *puVar2 << (bVar6 & 0x3f);
  return;
}

Assistant:

inline void execute_operation(asmcode::operand operand1,
    asmcode::operand operand2,
    uint64_t operand1_mem,
    uint64_t operand2_mem,
    registers& regs)
    {
    uint64_t* oprnd1 = get_address_64bit(operand1, operand1_mem, regs);
    if (oprnd1)
      {
      uint64_t* oprnd2 = get_address_64bit(operand2, operand2_mem, regs);
      if (oprnd2)
        TOper::apply(*oprnd1, *oprnd2);
      else if (operand2 == asmcode::NUMBER || operand2 == asmcode::LABELADDRESS)
        TOper::apply(*oprnd1, operand2_mem);
      else
        {
        uint8_t* oprnd2_8 = get_address_8bit(operand2, operand2_mem, regs);
        if (oprnd2_8)
          TOper::apply(*oprnd1, *oprnd2_8);
        }
      }
    else
      {
      uint8_t* oprnd1_8 = get_address_8bit(operand1, operand1_mem, regs);
      if (oprnd1_8)
        {
        uint8_t* oprnd2_8 = get_address_8bit(operand2, operand2_mem, regs);
        if (oprnd2_8)
          TOper::apply(*oprnd1_8, *oprnd2_8);
        else if (operand2 == asmcode::NUMBER)
          TOper::apply(*oprnd1_8, operand2_mem);
        }
      }
    }